

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O3

int dwarf_discr_list(Dwarf_Debug dbg,Dwarf_Small *blockpointer,Dwarf_Unsigned blocklen,
                    Dwarf_Dsc_Head *dsc_head_out,Dwarf_Unsigned *dsc_array_length_out,
                    Dwarf_Error *error)

{
  size_t sVar1;
  int iVar2;
  Dwarf_Small *blockpointer_00;
  Dwarf_Dsc_Head space;
  Dwarf_Dsc_Entry_s *pDVar3;
  size_t arraycount;
  size_t local_40;
  Dwarf_Unsigned *local_38;
  
  local_40 = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_discr_list()either null or it containsa stale Dwarf_Debug pointer"
                       );
  }
  else {
    if (blocklen == 0) {
      return -1;
    }
    local_38 = dsc_array_length_out;
    blockpointer_00 = (Dwarf_Small *)calloc(blocklen,1);
    if (blockpointer_00 != (Dwarf_Small *)0x0) {
      memcpy(blockpointer_00,blockpointer,blocklen);
      iVar2 = get_dsc_leb_entries(dbg,blockpointer_00,blocklen,0,(Dwarf_Dsc_Entry_s *)0x0,&local_40,
                                  error);
      if (iVar2 != 0) {
        free(blockpointer_00);
        return iVar2;
      }
      space = (Dwarf_Dsc_Head)_dwarf_get_alloc(dbg,'>',1);
      sVar1 = local_40;
      if (space == (Dwarf_Dsc_Head)0x0) {
        free(blockpointer_00);
      }
      else {
        space->dsh_block = blockpointer_00;
        space->dsh_block_len = blocklen;
        space->dsh_debug = dbg;
        pDVar3 = (Dwarf_Dsc_Entry_s *)calloc(local_40,0x28);
        if (pDVar3 != (Dwarf_Dsc_Entry_s *)0x0) {
          space->dsh_count = sVar1;
          space->dsh_array = pDVar3;
          space->dsh_set_unsigned = 0;
          space->dsh_set_signed = 0;
          *dsc_head_out = space;
          *local_38 = sVar1;
          return 0;
        }
        dwarf_dealloc(dbg,space,0x3e);
      }
    }
    _dwarf_error(dbg,error,0x3e);
  }
  return 1;
}

Assistant:

int dwarf_discr_list(Dwarf_Debug dbg,
    Dwarf_Small    * blockpointer,
    Dwarf_Unsigned   blocklen,
    Dwarf_Dsc_Head * dsc_head_out,
    Dwarf_Unsigned * dsc_array_length_out,
    Dwarf_Error    * error)
{
    Dwarf_Dsc_Head h = 0;
    int res = 0;
    size_t arraycount = 0;
    struct Dwarf_Dsc_Entry_s *ary = 0;
    Dwarf_Small * dscblockp = 0;
    Dwarf_Unsigned dscblocklen = 0;

    CHECK_DBG(dbg,error,"dwarf_discr_list()");
    if (blocklen == 0) {
        return DW_DLV_NO_ENTRY;
    }
    dscblockp = (Dwarf_Small *)calloc(blocklen,sizeof(Dwarf_Small));
    if (!dscblockp) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    dscblocklen = blocklen;
    memcpy(dscblockp,blockpointer,blocklen);

    res = get_dsc_leb_entries(dbg,dscblockp,dscblocklen,
        /*  TRUE or FALSE here is not important, the arraycount
            returned to us will be identical either way. */
        FALSE, 0, &arraycount,error);
    if (res != DW_DLV_OK) {
        free(dscblockp);
        return res;
    }

    h = (Dwarf_Dsc_Head)_dwarf_get_alloc(dbg,DW_DLA_DSC_HEAD,1);
    if (!h) {
        free(dscblockp);
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }

    h->dsh_block = dscblockp;
    h->dsh_block_len = dscblocklen;
    h->dsh_debug = dbg;
    /* Now the destructor for h will deal with block malloc space. */

    ary = (struct Dwarf_Dsc_Entry_s *)calloc(arraycount,
        sizeof(struct Dwarf_Dsc_Entry_s));
    if (!ary) {
        dwarf_dealloc(dbg,h,DW_DLA_DSC_HEAD);
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    h->dsh_count = arraycount;
    h->dsh_array = ary;
    h->dsh_set_unsigned = 0;
    h->dsh_set_signed = 0;

    *dsc_head_out = h;
    *dsc_array_length_out = arraycount;
    return DW_DLV_OK;
}